

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O2

Au_Obj_t * Au_ObjFanin(Au_Obj_t *p,int i)

{
  long lVar1;
  uint uVar2;
  
  lVar1 = *(long *)((ulong)p & 0xfffffffffffffc00);
  uVar2 = Au_ObjFaninId(p,i);
  return (Au_Obj_t *)
         ((ulong)((uVar2 & 0xfff) << 4) +
         *(long *)(*(long *)(lVar1 + 0x78) + (long)((int)uVar2 >> 0xc) * 8));
}

Assistant:

static inline Au_Obj_t *   Au_ObjFanin( Au_Obj_t * p, int i )            { return Au_NtkObj(Au_ObjNtk(p), Au_ObjFaninId(p, i));                                        }